

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler_goesn.cc
# Opt level: O3

Channel * __thiscall
GOESNImageHandler::loadChannel
          (Channel *__return_storage_ptr__,GOESNImageHandler *this,NOAALRITHeader *h)

{
  char *pcVar1;
  
  (__return_storage_ptr__->nameShort)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nameShort).field_2;
  (__return_storage_ptr__->nameShort)._M_string_length = 0;
  (__return_storage_ptr__->nameShort).field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->nameLong)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->nameLong).field_2;
  (__return_storage_ptr__->nameLong)._M_string_length = 0;
  (__return_storage_ptr__->nameLong).field_2._M_local_buf[0] = '\0';
  if (h->productSubID < 0xb) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b1807);
    pcVar1 = "Infrared";
  }
  else if (h->productSubID < 0x15) {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b1813);
    pcVar1 = "Visible";
  }
  else {
    std::__cxx11::string::_M_replace((ulong)__return_storage_ptr__,0,(char *)0x0,0x1b181e);
    pcVar1 = "Water Vapor";
  }
  std::__cxx11::string::_M_replace
            ((ulong)&__return_storage_ptr__->nameLong,0,
             (char *)(__return_storage_ptr__->nameLong)._M_string_length,(ulong)pcVar1);
  return __return_storage_ptr__;
}

Assistant:

Channel GOESNImageHandler::loadChannel(const lrit::NOAALRITHeader& h) const {
  Channel channel;
  if (h.productSubID <= 10) {
    channel.nameShort = "IR";
    channel.nameLong = "Infrared";
  } else if (h.productSubID <= 20) {
    channel.nameShort = "VS";
    channel.nameLong = "Visible";
  } else {
    channel.nameShort = "WV";
    channel.nameLong = "Water Vapor";
  }
  return channel;
}